

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

LinkIndex __thiscall iDynTree::Model::getFrameLink(Model *this,FrameIndex frameIndex)

{
  long lVar1;
  ostream *poVar2;
  LinkIndex LVar3;
  stringstream ss;
  long *local_1c8;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  if (frameIndex < 0) {
    lVar1 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  }
  else {
    lVar1 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    if (lVar1 - frameIndex != 0 && frameIndex <= lVar1) {
      return frameIndex;
    }
  }
  if ((frameIndex < lVar1) ||
     (((long)(this->additionalFrames).
             super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->additionalFrames).
             super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>._M_impl.
             super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 + lVar1 <= frameIndex)) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"frameIndex ",0xb);
    poVar2 = std::ostream::_M_insert<long>((long)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," is not valid, should be between 0 and ",0x27);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("Model","getFrameLink",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    LVar3 = LINK_INVALID_INDEX;
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  else {
    LVar3 = (this->additionalFramesLinks).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[frameIndex - lVar1];
  }
  return LVar3;
}

Assistant:

LinkIndex Model::getFrameLink(const FrameIndex frameIndex) const
{
    // The link_H_frame transform for the link
    // main frame is the link it self
    if( frameIndex >= 0 &&
        frameIndex < (FrameIndex) this->getNrOfLinks() )
    {
        return (LinkIndex)frameIndex;
    }

    if( frameIndex >= (FrameIndex) this->getNrOfLinks() &&
        frameIndex < (FrameIndex) this->getNrOfFrames() )
    {
        // For an additonal frame the link index is instead stored
        // in the additionalFramesLinks vector
        return this->additionalFramesLinks[frameIndex-getNrOfLinks()];
    }

    // If the frameIndex is out of bounds, return an invalid index
    std::stringstream ss;
    ss << "frameIndex " << frameIndex << " is not valid, should be between 0 and " << this->getNrOfFrames()-1;
    reportError("Model","getFrameLink",ss.str().c_str());
    return LINK_INVALID_INDEX;
}